

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O0

int run_test_udp_bind(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_198 [4];
  int r;
  uv_udp_t h2;
  uv_udp_t h1;
  uv_loop_t *loop;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x24,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop_00 = uv_default_loop();
  iVar1 = uv_udp_init(loop_00,(uv_udp_t *)&h2.write_completed_queue.prev);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x29,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_init(loop_00,(uv_udp_t *)local_198);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x2c,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind((uv_udp_t *)&h2.write_completed_queue.prev,(sockaddr *)&loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x2f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind((uv_udp_t *)local_198,(sockaddr *)&loop,0);
  if ((long)iVar1 != -0x62) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x32,"r","==","UV_EADDRINUSE",(long)iVar1,"==",0xffffffffffffff9e);
    abort();
  }
  uv_close((uv_handle_t *)&h2.write_completed_queue.prev,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)local_198,(uv_close_cb)0x0);
  iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x38,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
            ,0x3a,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_bind) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT_OK(r);

  r = uv_udp_init(loop, &h2);
  ASSERT_OK(r);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, 0);
  ASSERT_EQ(r, UV_EADDRINUSE);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}